

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O3

initiate_deregistration_result_t __thiscall
so_5::impl::coop_repository_basis_t::initiate_deregistration(coop_repository_basis_t *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_coop_operations_lock);
  if (iVar1 == 0) {
    bVar2 = this->m_deregistration_started != false;
    if (!bVar2) {
      this->m_deregistration_started = true;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_coop_operations_lock);
    return (uint)bVar2;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

coop_repository_basis_t::initiate_deregistration_result_t
coop_repository_basis_t::initiate_deregistration()
{
	initiate_deregistration_result_t result =
			initiate_deregistration_result_t::already_in_progress;
	{
		std::lock_guard< std::mutex > lock( m_coop_operations_lock );

		if( !m_deregistration_started )
		{
			m_deregistration_started = true;
			result = initiate_deregistration_result_t::initiated_first_time;
		}
	}

	return result;
}